

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

QUrl __thiscall QTextBrowserPrivate::resolveUrl(QTextBrowserPrivate *this,QUrl *url)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  QUrl *in_RDX;
  byte bVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QStringView QVar6;
  QLatin1String QVar7;
  QFileInfo fi;
  QArrayData *local_e8;
  QString local_d0;
  QUrl local_b8;
  undefined1 *local_b0;
  QArrayData *local_a8 [2];
  long local_98;
  QArrayData *local_90 [3];
  QFileInfo local_78 [8];
  QArrayData *local_70;
  storage_type_conflict *local_68;
  long local_60;
  QStringBuilder<QString,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QUrl::isRelative();
  if (cVar2 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QUrl::QUrl((QUrl *)this,in_RDX);
      return (QUrl)(QUrlPrivate *)this;
    }
    goto LAB_004ad712;
  }
  bVar3 = QUrl::isRelative();
  if (bVar3 == 0) {
    QUrl::scheme();
    if ((local_60 == 4) &&
       (QVar6.m_data = local_68, QVar6.m_size = 4, QVar7.m_data = "file", QVar7.m_size = 4,
       cVar2 = QtPrivate::equalStrings(QVar6,QVar7), cVar2 != '\0')) {
      QUrl::toLocalFile();
      QFileInfo::QFileInfo(local_78,(QString *)local_90);
      cVar2 = QFileInfo::isRelative();
      if (cVar2 != '\0') goto LAB_004ad40e;
      bVar3 = 1;
    }
    else {
      bVar3 = 0;
    }
    bVar1 = false;
    bVar4 = 1;
    bVar5 = true;
  }
  else {
LAB_004ad40e:
    bVar3 = bVar3 ^ 1;
    cVar2 = QUrl::hasFragment();
    bVar4 = bVar3;
    if (cVar2 == '\0') {
      bVar1 = false;
      bVar5 = false;
    }
    else {
      QUrl::path(local_a8);
      bVar5 = local_98 == 0;
      bVar1 = true;
    }
  }
  if ((bVar1) && (local_a8[0] != (QArrayData *)0x0)) {
    LOCK();
    (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8[0],2,0x10);
    }
  }
  if ((bVar3 != 0) && (QFileInfo::~QFileInfo(local_78), local_90[0] != (QArrayData *)0x0)) {
    LOCK();
    (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_90[0],2,0x10);
    }
  }
  if ((bVar4 != 0) && (local_70 != (QArrayData *)0x0)) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,0x10);
    }
  }
  if (bVar5) {
    QUrl::resolved((QUrl *)this);
  }
  else {
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QUrl::toLocalFile();
    QFileInfo::QFileInfo((QFileInfo *)&local_b0,(QString *)&local_58);
    if (&(local_58.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    cVar2 = QFileInfo::exists();
    if (cVar2 == '\0') {
      QUrl::QUrl((QUrl *)this,in_RDX);
    }
    else {
      QFileInfo::absolutePath();
      local_58.a.d.d = (Data *)local_e8;
      local_58.b.ucs = L'/';
      QStringBuilder<QString,_QChar>::convertTo<QString>(&local_d0,&local_58);
      QUrl::fromLocalFile((QString *)&local_b8);
      QUrl::resolved((QUrl *)this);
      QUrl::~QUrl(&local_b8);
      if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_b0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QUrl)(QUrlPrivate *)this;
  }
LAB_004ad712:
  __stack_chk_fail();
}

Assistant:

QUrl QTextBrowserPrivate::resolveUrl(const QUrl &url) const
{
    if (!url.isRelative())
        return url;

    // For the second case QUrl can merge "#someanchor" with "foo.html"
    // correctly to "foo.html#someanchor"
    if (!(currentURL.isRelative()
          || (currentURL.scheme() == "file"_L1
              && !QFileInfo(currentURL.toLocalFile()).isAbsolute()))
          || (url.hasFragment() && url.path().isEmpty())) {
        return currentURL.resolved(url);
    }

    // this is our last resort when current url and new url are both relative
    // we try to resolve against the current working directory in the local
    // file system.
    QFileInfo fi(currentURL.toLocalFile());
    if (fi.exists()) {
        return QUrl::fromLocalFile(fi.absolutePath() + QDir::separator()).resolved(url);
    }

    return url;
}